

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int transfer_get_state(TRANSFER_HANDLE transfer,AMQP_VALUE *state_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    iVar3 = 0x1eb7;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(transfer->composite_value,&item_count);
    iVar3 = 0x1ebf;
    if ((iVar1 == 0) && (iVar3 = 0x1ec5, 7 < item_count)) {
      value = amqpvalue_get_composite_item_in_place(transfer->composite_value,7);
      iVar3 = 0x1ecd;
      if (value != (AMQP_VALUE)0x0) {
        AVar2 = amqpvalue_get_type(value);
        if (AVar2 != AMQP_TYPE_NULL) {
          *state_value = value;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int transfer_get_state(TRANSFER_HANDLE transfer, AMQP_VALUE* state_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        if (amqpvalue_get_composite_item_count(transfer_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 7)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(transfer_instance->composite_value, 7);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *state_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}